

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QByteArray,char[2]>
                    (QList<QByteArray> *vector,char (*u) [2],qsizetype from)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  qsizetype qVar5;
  undefined7 extraout_var;
  long lVar6;
  long lVar7;
  QByteArray *lhs;
  long in_FS_OFFSET;
  char (*local_40) [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    lhs = (vector->d).ptr + from;
    qVar5 = uVar1 * 8;
    lVar2 = uVar1 * 0x18 + from * -0x18;
    lVar3 = 0x18 - (long)lhs;
    do {
      lVar7 = lVar3;
      lVar6 = lVar2;
      if (lVar6 == 0) goto LAB_002bdd6b;
      local_40 = u;
      bVar4 = ::operator==(lhs,(char **)&local_40);
      qVar5 = CONCAT71(extraout_var,bVar4);
      lhs = lhs + 1;
      lVar2 = lVar6 + -0x18;
      lVar3 = lVar7 + -0x18;
    } while (!bVar4);
    qVar5 = (-((long)&(vector->d).ptr[-1].d.d + lVar7) >> 3) * -0x5555555555555555;
LAB_002bdd6b:
    if (lVar6 != 0) goto LAB_002bdd77;
  }
  qVar5 = -1;
LAB_002bdd77:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}